

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O0

void __thiscall stk::FileWrite::closeAifFile(FileWrite *this)

{
  long lVar1;
  long local_28;
  unsigned_long bytes;
  unsigned_long uStack_18;
  int bytesPerSample;
  unsigned_long frames;
  FileWrite *this_local;
  
  uStack_18 = this->frameCounter_;
  frames = (unsigned_long)this;
  Stk::swap32((uchar *)&stack0xffffffffffffffe8);
  fseek((FILE *)this->fd_,0x16,0);
  fwrite(&stack0xffffffffffffffe8,4,1,(FILE *)this->fd_);
  bytes._4_4_ = 1;
  if (this->dataType_ == 2) {
    bytes._4_4_ = 2;
  }
  if (this->dataType_ == 4) {
    bytes._4_4_ = 3;
  }
  else if ((this->dataType_ == 8) || (this->dataType_ == 0x10)) {
    bytes._4_4_ = 4;
  }
  else if (this->dataType_ == 0x20) {
    bytes._4_4_ = 8;
  }
  lVar1 = this->frameCounter_ * (long)bytes._4_4_ * (ulong)this->channels_;
  local_28 = lVar1 + 0x2e;
  if ((this->dataType_ == 0x10) || (this->dataType_ == 0x20)) {
    local_28 = lVar1 + 0x34;
  }
  Stk::swap32((uchar *)&local_28);
  fseek((FILE *)this->fd_,4,0);
  fwrite(&local_28,4,1,(FILE *)this->fd_);
  lVar1 = this->frameCounter_ * (long)bytes._4_4_ * (ulong)this->channels_;
  local_28 = lVar1 + 8;
  if ((this->dataType_ == 0x10) || (this->dataType_ == 0x20)) {
    local_28 = lVar1 + 0xe;
  }
  Stk::swap32((uchar *)&local_28);
  if ((this->dataType_ == 0x10) || (this->dataType_ == 0x20)) {
    fseek((FILE *)this->fd_,0x30,0);
  }
  else {
    fseek((FILE *)this->fd_,0x2a,0);
  }
  fwrite(&local_28,4,1,(FILE *)this->fd_);
  fclose((FILE *)this->fd_);
  return;
}

Assistant:

void FileWrite :: closeAifFile( void )
{
  unsigned long frames = (unsigned long) frameCounter_;
#ifdef __LITTLE_ENDIAN__
  swap32((unsigned char *)&frames);
#endif
  fseek(fd_, 22, SEEK_SET); // jump to "COMM" sampleFrames
  fwrite(&frames, 4, 1, fd_);

  int bytesPerSample = 1;
  if ( dataType_ == STK_SINT16 )
    bytesPerSample = 2;
  if ( dataType_ == STK_SINT24 )
    bytesPerSample = 3;
  else if ( dataType_ == STK_SINT32 || dataType_ == STK_FLOAT32 )
    bytesPerSample = 4;
  else if ( dataType_ == STK_FLOAT64 )
    bytesPerSample = 8;

  unsigned long bytes = frameCounter_ * bytesPerSample * channels_ + 46;
  if ( dataType_ == STK_FLOAT32 || dataType_ == STK_FLOAT64 ) bytes += 6;
#ifdef __LITTLE_ENDIAN__
  swap32((unsigned char *)&bytes);
#endif
  fseek(fd_, 4, SEEK_SET); // jump to file size
  fwrite(&bytes, 4, 1, fd_);

  bytes = frameCounter_ * bytesPerSample * channels_ + 8;
  if ( dataType_ == STK_FLOAT32 || dataType_ == STK_FLOAT64 ) bytes += 6;
#ifdef __LITTLE_ENDIAN__
  swap32((unsigned char *)&bytes);
#endif
  if ( dataType_ == STK_FLOAT32 || dataType_ == STK_FLOAT64 )
    fseek(fd_, 48, SEEK_SET); // jump to "SSND" chunk size
  else
    fseek(fd_, 42, SEEK_SET); // jump to "SSND" chunk size
  fwrite(&bytes, 4, 1, fd_);

  fclose( fd_ );
}